

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOpaqueAttribute.cpp
# Opt level: O3

void __thiscall
Imf_3_4::OpaqueAttribute::OpaqueAttribute
          (OpaqueAttribute *this,char *typeName,long dataSize,void *data)

{
  char *__dest;
  allocator<char> local_21;
  
  Attribute::Attribute(&this->super_Attribute);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__OpaqueAttribute_001e3d38;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_typeName,typeName,&local_21);
  this->_dataSize = dataSize;
  (this->_data)._size = 0;
  (this->_data)._data = (char *)0x0;
  __dest = (char *)operator_new__(dataSize);
  (this->_data)._size = dataSize;
  (this->_data)._data = __dest;
  memcpy(__dest,data,dataSize);
  return;
}

Assistant:

OpaqueAttribute::OpaqueAttribute (const char  typeName[],
                                  long        dataSize,
                                  const void* data)
    : _typeName (typeName), _dataSize (dataSize)
{
    _data.resizeErase (dataSize);
    memcpy ((char*) _data, (const char*) data, dataSize);
}